

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status_test.cpp
# Opt level: O0

void __thiscall unit_test::handle2(unit_test *this)

{
  ostream *poVar1;
  __shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2> *unaff_retaddr;
  
  std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x10cc3c);
  cppcms::http::context::response();
  poVar1 = (ostream *)cppcms::http::response::out();
  std::operator<<(poVar1,"test message");
  std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
             )0x10cc69);
  cppcms::http::context::async_complete_response();
  std::__shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>::reset(unaff_retaddr);
  return;
}

Assistant:

void handle2()
	{
		context_->response().out()<<"test message";
		context_->async_complete_response();
		context_.reset();
	}